

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

MSize gola_new(LexState *ls,GCstr *name,uint8_t info,BCPos pc)

{
  uint uVar1;
  FuncState *pFVar2;
  VarInfo *pVVar3;
  MSize vtop;
  FuncState *fs;
  BCPos pc_local;
  uint8_t info_local;
  GCstr *name_local;
  LexState *ls_local;
  
  pFVar2 = ls->fs;
  uVar1 = ls->vtop;
  if (ls->sizevstack <= uVar1) {
    if (0xff87 < ls->sizevstack) {
      lj_lex_error(ls,0,LJ_ERR_XLIMC,0xff88);
    }
    pVVar3 = (VarInfo *)lj_mem_grow(ls->L,ls->vstack,&ls->sizevstack,0xff88,0x18);
    ls->vstack = pVVar3;
  }
  ls->vstack[uVar1].name.gcptr64 = (uint64_t)name;
  ls->vstack[uVar1].startpc = pc;
  ls->vstack[uVar1].slot = (uint8_t)pFVar2->nactvar;
  ls->vstack[uVar1].info = info;
  ls->vtop = uVar1 + 1;
  return uVar1;
}

Assistant:

static MSize gola_new(LexState *ls, GCstr *name, uint8_t info, BCPos pc)
{
  FuncState *fs = ls->fs;
  MSize vtop = ls->vtop;
  if (LJ_UNLIKELY(vtop >= ls->sizevstack)) {
    if (ls->sizevstack >= LJ_MAX_VSTACK)
      lj_lex_error(ls, 0, LJ_ERR_XLIMC, LJ_MAX_VSTACK);
    lj_mem_growvec(ls->L, ls->vstack, ls->sizevstack, LJ_MAX_VSTACK, VarInfo);
  }
  lj_assertFS(name == NAME_BREAK || lj_tab_getstr(fs->kt, name) != NULL,
	      "unanchored label name");
  /* NOBARRIER: name is anchored in fs->kt and ls->vstack is not a GCobj. */
  setgcref(ls->vstack[vtop].name, obj2gco(name));
  ls->vstack[vtop].startpc = pc;
  ls->vstack[vtop].slot = (uint8_t)fs->nactvar;
  ls->vstack[vtop].info = info;
  ls->vtop = vtop+1;
  return vtop;
}